

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::CommandLineInterface::Clear(CommandLineInterface *this)

{
  (this->executable_name_)._M_string_length = 0;
  *(this->executable_name_)._M_dataplus._M_p = '\0';
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_at_end(&this->proto_path_,
                    (this->proto_path_).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->input_files_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->direct_dependencies_)._M_t);
  std::__cxx11::string::_M_replace
            ((ulong)&this->direct_dependencies_violation_msg_,0,
             (char *)(this->direct_dependencies_violation_msg_)._M_string_length,0x3d9c05);
  std::
  vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
  ::_M_erase_at_end(&this->output_directives_,
                    (this->output_directives_).
                    super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->codec_type_)._M_string_length = 0;
  *(this->codec_type_)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->descriptor_set_in_names_);
  (this->descriptor_set_out_name_)._M_string_length = 0;
  *(this->descriptor_set_out_name_)._M_dataplus._M_p = '\0';
  (this->dependency_out_name_)._M_string_length = 0;
  *(this->dependency_out_name_)._M_dataplus._M_p = '\0';
  this->mode_ = MODE_COMPILE;
  this->print_mode_ = PRINT_NONE;
  this->direct_dependencies_explicitly_set_ = false;
  this->imports_in_descriptor_set_ = false;
  this->source_info_in_descriptor_set_ = false;
  this->disallow_services_ = false;
  this->deterministic_output_ = false;
  return;
}

Assistant:

void CommandLineInterface::Clear() {
  // Clear all members that are set by Run().  Note that we must not clear
  // members which are set by other methods before Run() is called.
  executable_name_.clear();
  proto_path_.clear();
  input_files_.clear();
  direct_dependencies_.clear();
  direct_dependencies_violation_msg_ = kDefaultDirectDependenciesViolationMsg;
  output_directives_.clear();
  codec_type_.clear();
  descriptor_set_in_names_.clear();
  descriptor_set_out_name_.clear();
  dependency_out_name_.clear();


  mode_ = MODE_COMPILE;
  print_mode_ = PRINT_NONE;
  imports_in_descriptor_set_ = false;
  source_info_in_descriptor_set_ = false;
  disallow_services_ = false;
  direct_dependencies_explicitly_set_ = false;
  deterministic_output_ = false;
}